

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O1

void __thiscall deci::ast_unary_t::~ast_unary_t(ast_unary_t *this)

{
  pointer pcVar1;
  
  if (this->chain != (ast_item_t *)0x0) {
    (*this->chain->_vptr_ast_item_t[4])();
  }
  pcVar1 = (this->identifier)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->identifier).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011e3c8;
  return;
}

Assistant:

ast_unary_t::~ast_unary_t() {
    delete this->chain;
  }